

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression(xpath_parser *this,int limit)

{
  undefined8 uVar1;
  ulong uVar2;
  xpath_ast_node *pxVar3;
  undefined4 in_ESI;
  long in_RDI;
  xpath_ast_node *n;
  size_t old_depth;
  int in_stack_0000005c;
  xpath_ast_node *in_stack_00000060;
  xpath_parser *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x68);
  uVar2 = *(long *)(in_RDI + 0x68) + 1;
  *(ulong *)(in_RDI + 0x68) = uVar2;
  if (uVar2 < 0x401) {
    pxVar3 = parse_path_or_unary_expression
                       ((xpath_parser *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    if (pxVar3 == (xpath_ast_node *)0x0) {
      local_8 = (xpath_ast_node *)0x0;
    }
    else {
      local_8 = parse_expression_rec(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
      *(undefined8 *)(in_RDI + 0x68) = uVar1;
    }
  }
  else {
    local_8 = error_rec((xpath_parser *)0x16027e);
  }
  return local_8;
}

Assistant:

xpath_ast_node* parse_expression(int limit = 0)
		{
			size_t old_depth = _depth;

			if (++_depth > xpath_ast_depth_limit)
				return error_rec();

			xpath_ast_node* n = parse_path_or_unary_expression();
			if (!n) return NULL;

			n = parse_expression_rec(n, limit);

			_depth = old_depth;

			return n;
		}